

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O3

int Cec_ManChoiceComputation_int(Gia_Man_t *pAig,Cec_ParChc_t *pPars)

{
  Vec_Str_t *pVVar1;
  int iVar2;
  Cec_ManSim_t *p;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  int level;
  Cec_ParSat_t *p_01;
  Gia_Man_t *pAig_00;
  double dVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  timespec ts_2;
  Vec_Str_t *vStatus;
  Vec_Int_t *vOutputs;
  Cec_ParSim_t ParsSim;
  Cec_ParSat_t ParsSat;
  timespec local_d8;
  double local_c8;
  double local_c0;
  Gia_Man_t *local_b8;
  Vec_Str_t *local_b0;
  double local_a8;
  Cec_ManSim_t *local_a0;
  double local_98;
  double local_90;
  Vec_Int_t *local_88;
  Cec_ParSim_t local_80;
  Cec_ParSat_t local_50;
  
  local_b8 = pAig;
  iVar2 = clock_gettime(3,(timespec *)&local_80);
  lVar7 = 1;
  lVar8 = 1;
  if (-1 < iVar2) {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_80._8_8_),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_80._0_8_ * -1000000;
  }
  iVar2 = clock_gettime(3,(timespec *)&local_80);
  pAig_00 = local_b8;
  if (-1 < iVar2) {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_80._8_8_),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_80._0_8_ * -1000000;
  }
  if (local_b8->pReprs != (Gia_Rpr_t *)0x0) {
    free(local_b8->pReprs);
    pAig_00->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (pAig_00->pNexts != (int *)0x0) {
    free(pAig_00->pNexts);
    pAig_00->pNexts = (int *)0x0;
  }
  local_c0 = (double)CONCAT44(local_c0._4_4_,1);
  Gia_ManRandom(1);
  Cec_ManSimSetDefaultParams(&local_80);
  local_80.nWords = pPars->nWords;
  local_80.nFrames = pPars->nRounds;
  local_80.fVerbose = pPars->fVerbose;
  local_80.fSeqSimulate = 0;
  local_80.fLatchCorr = 0;
  p = Cec_ManSimStart(pAig_00,&local_80);
  Cec_ManSimClassesPrepare(p,-1);
  local_a0 = p;
  Cec_ManSimClassesRefine(p);
  p_01 = &local_50;
  Cec_ManSatSetDefaultParams(p_01);
  local_50.nBTLimit = pPars->nBTLimit;
  local_50.fVerbose = pPars->fVerbose;
  if (local_50.fVerbose != 0) {
    Abc_Print((int)p_01,"Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",
              (ulong)(uint)pAig_00->nObjs,
              (ulong)(uint)(~(pAig_00->vCos->nSize + pAig_00->vCis->nSize) + pAig_00->nObjs),
              (ulong)(uint)local_50.nBTLimit,(ulong)(uint)pPars->fUseRings,pPars->fUseCSat);
    iVar2 = clock_gettime(3,&local_d8);
    pAig_00 = local_b8;
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
    }
    Cec_ManRefinedClassPrintStats(local_b8,(Vec_Str_t *)0x0,0,lVar4 + lVar7);
  }
  lVar7 = 0;
  local_a8 = 0.0;
  local_c8 = 0.0;
  local_90 = (double)lVar8;
  while( true ) {
    iVar2 = clock_gettime(3,&local_d8);
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
    }
    iVar2 = clock_gettime(3,&local_d8);
    if (iVar2 < 0) {
      lVar4 = 1;
    }
    else {
      lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d8.tv_nsec),8);
      lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_d8.tv_sec * -1000000;
    }
    p_00 = Cec_ManCombSpecReduce(pAig_00,&local_88,pPars->fUseRings);
    if ((p_00->nRegs != 0) || (p_00->vCis->nSize != pAig_00->vCis->nSize)) {
      __assert_fail("Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecChoice.c"
                    ,0xf5,"int Cec_ManChoiceComputation_int(Gia_Man_t *, Cec_ParChc_t *)");
    }
    iVar2 = clock_gettime(3,&local_d8);
    if (iVar2 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
    }
    lVar7 = lVar7 + lVar4 + lVar5;
    if (p_00->vCos->nSize == 0) {
      if (pPars->fVerbose != 0) {
        iVar2 = clock_gettime(3,&local_d8);
        if (iVar2 < 0) {
          lVar4 = -1;
        }
        else {
          lVar4 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
        }
        Cec_ManRefinedClassPrintStats(pAig_00,(Vec_Str_t *)0x0,local_c0._0_4_,lVar4 - lVar8);
      }
      if (local_88->pArray != (int *)0x0) {
        free(local_88->pArray);
      }
      free(local_88);
      Gia_ManStop(p_00);
      dVar6 = local_c8;
      goto LAB_005c9af8;
    }
    iVar2 = clock_gettime(3,&local_d8);
    if (iVar2 < 0) {
      lVar4 = 1;
    }
    else {
      lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d8.tv_nsec),8);
      lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_d8.tv_sec * -1000000;
    }
    local_98 = (double)lVar8;
    if (pPars->fUseCSat == 0) {
      pVVar3 = Cec_ManSatSolveMiter(p_00,&local_50,&local_b0);
    }
    else {
      pVVar3 = Cbs_ManSolveMiterNc(p_00,pPars->nBTLimit,&local_b0,0);
    }
    Gia_ManStop(p_00);
    iVar2 = clock_gettime(3,&local_d8);
    pVVar1 = local_b0;
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
    }
    dVar6 = (double)((long)local_c8 + lVar4 + lVar8);
    if (pVVar3->nSize == 0) break;
    local_c8 = dVar6;
    iVar2 = clock_gettime(3,&local_d8);
    if (iVar2 < 0) {
      lVar8 = 1;
    }
    else {
      lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d8.tv_nsec),8);
      lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_d8.tv_sec * -1000000;
    }
    Cec_ManResimulateCounterExamplesComb(local_a0,pVVar3);
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
    iVar2 = clock_gettime(3,&local_d8);
    pVVar3 = local_88;
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
    }
    Gia_ManCheckRefinements(pAig_00,local_b0,local_88,local_a0,pPars->fUseRings);
    pVVar1 = local_b0;
    if (pPars->fVerbose != 0) {
      iVar2 = clock_gettime(3,&local_d8);
      if (iVar2 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
      }
      Cec_ManRefinedClassPrintStats(local_b8,pVVar1,local_c0._0_4_,lVar5 - (long)local_98);
    }
    pVVar1 = local_b0;
    if (local_b0->pArray != (char *)0x0) {
      free(local_b0->pArray);
    }
    free(pVVar1);
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
    }
    local_a8 = (double)((long)local_a8 + lVar8 + lVar4);
    free(pVVar3);
    iVar2 = local_c0._0_4_ + 1;
    local_c0 = (double)CONCAT44(local_c0._4_4_,iVar2);
    pAig_00 = local_b8;
    if (iVar2 == 0x3e9) {
      Abc_Print((int)pVVar3,"The refinement was not finished. The result may be incorrect.\n");
      dVar6 = local_c8;
LAB_005c9af8:
      Cec_ManSimStop(local_a0);
      level = 3;
      iVar2 = clock_gettime(3,&local_d8);
      if (iVar2 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
      }
      if (pPars->fVerbose != 0) {
        lVar8 = lVar8 + (long)local_90;
        Abc_Print(level,"%s =","Srm  ");
        dVar11 = (double)lVar8;
        local_98 = 0.0;
        dVar10 = 0.0;
        bVar9 = lVar8 != 0;
        if (bVar9) {
          dVar10 = ((double)lVar7 * 100.0) / dVar11;
        }
        local_b8 = (Gia_Man_t *)0x0;
        if (bVar9) {
          local_b8 = (Gia_Man_t *)(((double)(long)dVar6 * 100.0) / dVar11);
        }
        local_c8 = 0.0;
        if (bVar9) {
          local_c8 = ((double)(long)local_a8 * 100.0) / dVar11;
        }
        local_a0 = (Cec_ManSim_t *)((double)(long)dVar6 / 1000000.0);
        local_c0 = (double)(long)local_a8 / 1000000.0;
        local_90 = (double)(lVar8 - (lVar7 + (long)local_a8 + (long)dVar6));
        if (bVar9) {
          local_98 = (local_90 * 100.0) / dVar11;
        }
        local_a8 = dVar11;
        Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar7 / 1000000.0,dVar10);
        Abc_Print(level,"%s =","Sat  ");
        Abc_Print(level,"%9.2f sec (%6.2f %%)\n",local_a0,local_b8);
        Abc_Print(level,"%s =","Sim  ");
        Abc_Print(level,"%9.2f sec (%6.2f %%)\n",local_c0,local_c8);
        Abc_Print(level,"%s =","Other");
        Abc_Print(level,"%9.2f sec (%6.2f %%)\n",local_90 / 1000000.0,local_98);
        Abc_Print(level,"%s =","TOTAL");
        Abc_Print(level,"%9.2f sec\n",local_a8 / 1000000.0);
      }
      return 0;
    }
  }
  if (pPars->fVerbose != 0) {
    iVar2 = clock_gettime(3,&local_d8);
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
    }
    Cec_ManRefinedClassPrintStats(pAig_00,pVVar1,local_c0._0_4_,lVar8 - (long)local_98);
  }
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  if (local_b0->pArray != (char *)0x0) {
    free(local_b0->pArray);
  }
  free(local_b0);
  if (local_88->pArray != (int *)0x0) {
    free(local_88->pArray);
  }
  free(local_88);
  goto LAB_005c9af8;
}

Assistant:

int Cec_ManChoiceComputation_int( Gia_Man_t * pAig, Cec_ParChc_t * pPars )
{
    int nItersMax = 1000;
    Vec_Str_t * vStatus;
    Vec_Int_t * vOutputs;
    Vec_Int_t * vCexStore;
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Cec_ManSim_t * pSim;
    Gia_Man_t * pSrm;
    int r, RetValue;
    abctime clkSat = 0, clkSim = 0, clkSrm = 0, clkTotal = Abc_Clock();
    abctime clk2, clk = Abc_Clock();
    ABC_FREE( pAig->pReprs );
    ABC_FREE( pAig->pNexts );
    Gia_ManRandom( 1 );
    // prepare simulation manager
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords     = pPars->nWords;
    pParsSim->nFrames    = pPars->nRounds;
    pParsSim->fVerbose   = pPars->fVerbose;
    pParsSim->fLatchCorr   = 0;
    pParsSim->fSeqSimulate = 0;
    // create equivalence classes of registers
    pSim = Cec_ManSimStart( pAig, pParsSim );
    Cec_ManSimClassesPrepare( pSim, -1 );
    Cec_ManSimClassesRefine( pSim );
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",
            Gia_ManObjNum(pAig), Gia_ManAndNum(pAig), pPars->nBTLimit, pPars->fUseRings, pPars->fUseCSat );
        Cec_ManRefinedClassPrintStats( pAig, NULL, 0, Abc_Clock() - clk );
    }
    // perform refinement of equivalence classes
    for ( r = 0; r < nItersMax; r++ )
    { 
        clk = Abc_Clock();
        // perform speculative reduction
        clk2 = Abc_Clock();
        pSrm = Cec_ManCombSpecReduce( pAig, &vOutputs, pPars->fUseRings );
        assert( Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig) );
        clkSrm += Abc_Clock() - clk2;
        if ( Gia_ManCoNum(pSrm) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, NULL, r+1, Abc_Clock() - clk );
            Vec_IntFree( vOutputs );
            Gia_ManStop( pSrm );            
            break;
        }
//Gia_DumpAiger( pSrm, "choicesrm", r, 2 );
        // found counter-examples to speculation
        clk2 = Abc_Clock();
        if ( pPars->fUseCSat )
            vCexStore = Cbs_ManSolveMiterNc( pSrm, pPars->nBTLimit, &vStatus, 0 );
        else
            vCexStore = Cec_ManSatSolveMiter( pSrm, pParsSat, &vStatus );
        Gia_ManStop( pSrm );
        clkSat += Abc_Clock() - clk2;
        if ( Vec_IntSize(vCexStore) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
            Vec_IntFree( vCexStore );
            Vec_StrFree( vStatus );
            Vec_IntFree( vOutputs );
            break;
        }
        // refine classes with these counter-examples
        clk2 = Abc_Clock();
        RetValue = Cec_ManResimulateCounterExamplesComb( pSim, vCexStore );
        Vec_IntFree( vCexStore );
        clkSim += Abc_Clock() - clk2;
        Gia_ManCheckRefinements( pAig, vStatus, vOutputs, pSim, pPars->fUseRings );
        if ( pPars->fVerbose )
            Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
        Vec_StrFree( vStatus );
        Vec_IntFree( vOutputs );
//Gia_ManEquivPrintClasses( pAig, 1, 0 );
    }
    // check the overflow
    if ( r == nItersMax )
        Abc_Print( 1, "The refinement was not finished. The result may be incorrect.\n" );
    Cec_ManSimStop( pSim );
    clkTotal = Abc_Clock() - clkTotal;
    // report the results
    if ( pPars->fVerbose )
    {
        Abc_PrintTimeP( 1, "Srm  ", clkSrm,                        clkTotal );
        Abc_PrintTimeP( 1, "Sat  ", clkSat,                        clkTotal );
        Abc_PrintTimeP( 1, "Sim  ", clkSim,                        clkTotal );
        Abc_PrintTimeP( 1, "Other", clkTotal-clkSat-clkSrm-clkSim, clkTotal );
        Abc_PrintTime( 1, "TOTAL",  clkTotal );
    }
    return 0;
}